

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

void voc_parse_disambig(voccxdef *ctx)

{
  ushort uVar1;
  int iVar2;
  runcxdef *ctx_00;
  runsdef *prVar3;
  objnum *poVar4;
  voccxdef *pvVar5;
  objnum oVar6;
  uchar *puVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  uint16_t tmp_2;
  undefined2 uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int32_t tmp;
  ulong uVar17;
  ulong uVar18;
  uint16_t tmp_1;
  vocoldef *pvVar19;
  errcxdef *ctx_01;
  ushort *puVar20;
  ulong uVar21;
  uchar uVar22;
  int iVar23;
  char **ppcVar24;
  char **cmd;
  int iVar25;
  char *oopsbuflen;
  char *pcVar26;
  vocoldef *pvVar27;
  vocoldef *pvVar28;
  uint local_1274;
  ushort *local_1270;
  uint subsiz;
  uchar local_125d;
  uint objsiz;
  char **local_1258;
  ushort local_124a;
  objnum local_1248;
  objnum local_1246;
  objnum local_1244;
  objnum local_1242;
  vocoldef *local_1240;
  voccxdef *local_1238;
  vocoldef *local_1230;
  uchar *objp;
  ulong local_1220;
  vocoldef *local_1218;
  ulong local_1210;
  char **local_1208;
  char **local_1200;
  undefined8 local_11f8;
  voccxdef ctx_copy;
  
  pvVar28 = (vocoldef *)ctx->voc_stk_cur;
  pvVar19 = (vocoldef *)ctx->voc_stk_end;
  pvVar27 = pvVar28 + 200;
  if (pvVar27 <= pvVar19) {
    ctx_00 = ctx->voccxrun;
    ctx->voc_stk_cur = (uchar *)pvVar27;
    ppcVar24 = &pvVar28[0xcb].vocolfst;
    if (ppcVar24 <= pvVar19) {
      ctx->voc_stk_cur = (uchar *)ppcVar24;
      if (&pvVar28[0xce].vocollst <= pvVar19) {
        ctx->voc_stk_cur = (uchar *)&pvVar28[0xce].vocollst;
        prVar3 = ctx_00->runcxsp;
        ctx_00->runcxsp = prVar3 + -1;
        if (prVar3[-1].runstyp != '\x02') {
LAB_001f9105:
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3f2);
        }
        local_1242 = prVar3[-1].runsv.runsvobj;
        ctx_00->runcxsp = prVar3 + -2;
        if (prVar3[-2].runstyp != '\x02') goto LAB_001f9105;
        local_1244 = prVar3[-2].runsv.runsvobj;
        ctx_00->runcxsp = prVar3 + -3;
        local_1246 = 0xffff;
        local_1248 = 0xffff;
        if (prVar3[-3].runstyp != '\x05') {
          if (prVar3[-3].runstyp != '\x02') goto LAB_001f9105;
          local_1248 = prVar3[-3].runsv.runsvobj;
        }
        ctx_00->runcxsp = prVar3 + -4;
        if (prVar3[-4].runstyp != '\x05') {
          if (prVar3[-4].runstyp != '\x02') goto LAB_001f9105;
          local_1246 = prVar3[-4].runsv.runsvobj;
        }
        ctx_00->runcxsp = prVar3 + -5;
        if (prVar3[-5].runstyp != '\x01') {
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3eb);
        }
        local_124a = 10;
        if (prVar3[-5].runsv.runsvnum == 3) {
          uVar11 = 0x29;
        }
        else {
          uVar11 = 0x15;
          if (prVar3[-5].runsv.runsvnum == 2) {
            local_124a = 0xb;
            uVar11 = 0x16;
          }
        }
        ctx_00->runcxsp = prVar3 + -6;
        if (prVar3[-6].runstyp != '\r') {
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3f4);
        }
        local_1210 = CONCAT62(local_1210._2_6_,prVar3[-6].runsv.runsvobj);
        ctx_00->runcxsp = prVar3 + -7;
        if (prVar3[-7].runstyp != '\a') {
LAB_001f911c:
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3fc);
        }
        local_1220 = CONCAT62(local_1220._2_6_,uVar11);
        puVar20 = (ushort *)prVar3[-7].runsv.runsvstr;
        uVar1 = *puVar20;
        ctx_00->runcxsp = prVar3 + -8;
        if (prVar3[-8].runstyp != '\a') goto LAB_001f911c;
        objsiz = *(ushort *)prVar3[-8].runsv.runsvstr - 2;
        objp = (uchar *)((long)prVar3[-8].runsv.runsvstr + 2);
        ctx_00->runcxsp = prVar3 + -9;
        local_125d = prVar3[-9].runstyp;
        local_11f8 = 1;
        if ((local_125d != '\b') && (local_11f8 = 0, local_125d != '\x05')) {
          ctx_00->runcxerr->errcxptr->erraac = 0;
          runsign(ctx_00,0x3ed);
        }
        uVar12 = uVar1 - 2;
        puVar20 = puVar20 + 1;
        local_1274 = uVar12;
        local_1270 = puVar20;
        local_1240 = pvVar27;
        local_1238 = ctx;
        local_1218 = pvVar28;
        local_1200 = ppcVar24;
        if (uVar12 == 0) {
          ppcVar24 = (char **)0x0;
        }
        else {
          ppcVar24 = (char **)0x0;
          do {
            ppcVar24 = (char **)(ulong)((int)ppcVar24 + (uint)((char)*local_1270 == '\x03'));
            lstadv((uchar **)&local_1270,&local_1274);
          } while (local_1274 != 0);
        }
        cmd = (char **)local_1238->voc_stk_cur;
        puVar7 = (uchar *)((ulong)((int)ppcVar24 * 8 + 8) + (long)cmd);
        local_1208 = ppcVar24;
        if (puVar7 <= local_1238->voc_stk_end) {
          local_1238->voc_stk_cur = puVar7;
          uVar17 = 0;
          local_1274 = uVar12;
          local_1270 = puVar20;
          local_1258 = cmd;
          if (uVar12 != 0) {
            pvVar27 = local_1240;
            do {
              if ((char)*local_1270 == '\x03') {
                iVar13 = (int)uVar17;
                uVar17 = (ulong)(iVar13 + 1);
                cmd[iVar13] = (char *)pvVar27;
                uVar1 = *(ushort *)((long)local_1270 + 1);
                uVar21 = (ulong)(uVar1 - 2);
                memcpy(pvVar27,(char *)((long)local_1270 + 3),uVar21);
                *(uchar *)((long)&pvVar27->vocolobj + uVar21) = '\0';
                pvVar27 = (vocoldef *)((long)&pvVar27->vocolobj + (ulong)(uVar1 - 1));
                cmd = local_1258;
              }
              lstadv((uchar **)&local_1270,&local_1274);
            } while (local_1274 != 0);
            uVar17 = (ulong)(int)uVar17;
          }
          cmd[uVar17] = (char *)0x0;
          if ((objsiz != 0) && (*objp == '\x01')) {
            lstadv(&objp,&objsiz);
          }
          local_1270 = (ushort *)objp;
          local_1274 = objsiz;
          if (objsiz == 0) {
            uVar17 = 0x28;
          }
          else {
            iVar13 = 0;
            do {
              if ((char)*local_1270 == '\a') {
                ctx_copy.voccxerr = (errcxdef *)((long)local_1270 + 3);
                subsiz = *(ushort *)((long)local_1270 + 1) - 2;
                while (subsiz != 0) {
                  if ((*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x05') ||
                     (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x02')) {
                    iVar13 = iVar13 + 1;
                  }
                  lstadv((uchar **)&ctx_copy,&subsiz);
                }
              }
              lstadv((uchar **)&local_1270,&local_1274);
            } while (local_1274 != 0);
            uVar17 = (ulong)(iVar13 * 0x28 + 0x28);
            cmd = local_1258;
          }
          local_1230 = (vocoldef *)local_1238->voc_stk_cur;
          puVar7 = (uchar *)((long)&local_1230->vocolobj + uVar17);
          if (puVar7 <= local_1238->voc_stk_end) {
            local_1238->voc_stk_cur = puVar7;
            local_1270 = (ushort *)objp;
            local_1274 = objsiz;
            if (objsiz == 0) {
              lVar16 = 0;
              iVar13 = 0;
            }
            else {
              iVar13 = 0;
              iVar25 = 0;
              do {
                if ((uchar)*local_1270 == '\a') {
                  ctx_copy.voccxerr = (errcxdef *)((long)local_1270 + 3);
                  iVar23 = 0;
                  subsiz = *(ushort *)((long)local_1270 + 1) - 2;
                  if ((subsiz != 0) && (*(uchar *)&(ctx_copy.voccxerr)->errcxptr == '\x01')) {
                    iVar23 = *(int *)(local_1270 + 2) + -1;
                    if ((int)local_1208 <= iVar23) {
                      iVar23 = (int)local_1208;
                    }
                    if (*(int *)(local_1270 + 2) < 1) {
                      iVar23 = 0;
                    }
                    lstadv((uchar **)&ctx_copy,&subsiz);
                  }
                  if ((subsiz == 0) || (*(char *)&(ctx_copy.voccxerr)->errcxptr != '\x01')) {
                    lVar16 = 0;
                  }
                  else {
                    iVar2 = *(int *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
                    iVar14 = iVar2 + -1;
                    if ((int)local_1208 <= iVar14) {
                      iVar14 = (int)local_1208;
                    }
                    if (iVar2 <= iVar23) {
                      iVar14 = iVar23;
                    }
                    lstadv((uchar **)&ctx_copy,&subsiz);
                    lVar16 = (long)iVar14;
                  }
                  cmd = local_1258;
                  if (subsiz != 0) {
                    do {
                      if (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x05') {
                        oVar6 = 0xffff;
LAB_001f8c3c:
                        pvVar27 = local_1230 + iVar25;
                        pvVar27->vocolobj = oVar6;
                        pvVar27->vocolfst = local_1258[iVar23];
                        pvVar27->vocollst = local_1258[lVar16];
                        lstadv((uchar **)&ctx_copy,&subsiz);
                        if ((subsiz == 0) || (*(char *)&(ctx_copy.voccxerr)->errcxptr != '\x01')) {
                          pvVar27->vocolflg = 0;
                        }
                        else {
                          pvVar27->vocolflg = *(int *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
                          lstadv((uchar **)&ctx_copy,&subsiz);
                        }
                        iVar13 = iVar13 + (uint)(((uint)pvVar27->vocolflg >> 0xb & 1) != 0);
                        iVar25 = iVar25 + 1;
                      }
                      else {
                        if (*(char *)&(ctx_copy.voccxerr)->errcxptr == '\x02') {
                          oVar6 = *(objnum *)((long)&(ctx_copy.voccxerr)->errcxptr + 1);
                          goto LAB_001f8c3c;
                        }
                        lstadv((uchar **)&ctx_copy,&subsiz);
                      }
                      cmd = local_1258;
                    } while (subsiz != 0);
                  }
                }
                lstadv((uchar **)&local_1270,&local_1274);
              } while (local_1274 != 0);
              lVar16 = (long)iVar25;
            }
            pvVar27 = local_1230;
            local_1230[lVar16].vocolobj = 0xffff;
            local_1230[lVar16].vocolflg = 0;
            memcpy(&ctx_copy,local_1238,0x11c0);
            pvVar28 = local_1218;
            uVar17 = (ulong)local_1246;
            pcVar9 = (char *)(ulong)local_124a;
            ctx_copy.voccxunknown = iVar13;
            ctx_copy.voccxlastunk = iVar13;
            iVar13 = vocdisambig(&ctx_copy,local_1218,pvVar27,local_124a,(prpnum)local_1220,
                                 (prpnum)local_1210,cmd,local_1246,local_1242,local_1244,local_1248,
                                 (char *)local_1240,(int)local_11f8);
            if (((local_125d != '\b') && (iVar13 == 2)) && (ctx_copy.voccxunknown != 0)) {
              ctx_copy.voccxunknown = 0;
              pcVar26 = *cmd;
              if (pcVar26 == (char *)0x0) {
                oopsbuflen = (char *)0x0;
              }
              else {
                uVar21 = 0;
                oopsbuflen = (char *)0x0;
                do {
                  sVar8 = strlen(pcVar26);
                  pcVar9 = (char *)0x1;
                  iVar25 = voc_lookup_type(local_1238,pcVar26,(int)sVar8,1);
                  if (iVar25 == 0) {
                    oopsbuflen = cmd[uVar21];
                    uVar17 = uVar21 & 0xffffffff;
                    break;
                  }
                  pcVar26 = cmd[uVar21 + 1];
                  uVar21 = uVar21 + 1;
                } while (pcVar26 != (char *)0x0);
              }
              ppcVar24 = local_1200;
              if (oopsbuflen == (char *)0x0) {
                oopsbuflen = *cmd;
                uVar17 = 0;
              }
              local_1230 = (vocoldef *)
                           voc_read_oops(&ctx_copy,(char *)local_1200,(size_t)oopsbuflen,pcVar9);
              if (local_1230 == (vocoldef *)0x0) {
                ctx_copy.voccxredo = 1;
                strcpy((char *)local_1240,(char *)ppcVar24);
                pvVar28 = local_1218;
              }
              else {
                local_1208 = &local_1240[3].vocolfst;
                uVar21 = 0;
                pvVar27 = local_1240;
                local_1220 = uVar17;
                do {
                  pvVar28 = (vocoldef *)cmd[uVar21];
                  if (pvVar28 == (vocoldef *)0x0) break;
                  pvVar19 = pvVar28;
                  if (uVar21 == uVar17) {
                    pvVar19 = local_1230;
                  }
                  sVar8 = strlen((char *)pvVar19);
                  uVar10 = (sVar8 != 0 && cmd[uVar21 + 1] != (char *)0x0) + sVar8 + 1;
                  uVar18 = (long)local_1208 - (long)pvVar27;
                  if (uVar10 <= uVar18) {
                    pvVar19 = local_1230;
                    local_1210 = uVar10;
                    if ((uVar21 == uVar17) || (pvVar19 = pvVar28, (char)pvVar28->vocolobj != '\"'))
                    {
                      strcpy((char *)pvVar27,(char *)pvVar19);
                    }
                    else {
                      pcVar9 = &pvVar28->field_0x2;
                      do {
                        pcVar26 = pcVar9 + -1;
                        uVar22 = '\"';
                        if ((*pcVar26 == '\0') || (*pcVar9 == '\0')) goto LAB_001f8ef1;
                        pcVar9 = pcVar9 + 1;
                      } while (*pcVar26 != '\"');
                      uVar22 = '\'';
LAB_001f8ef1:
                      *(uchar *)&pvVar27->vocolobj = uVar22;
                      puVar7 = (uchar *)((long)&pvVar27->vocolobj + 1);
                      pcVar9 = local_1258[uVar21];
                      sVar8 = strlen(pcVar9);
                      if (2 < sVar8) {
                        memcpy(puVar7,pcVar9 + 1,sVar8 - 2);
                        sVar8 = strlen(local_1258[uVar21]);
                        puVar7 = puVar7 + (sVar8 - 2);
                      }
                      *puVar7 = uVar22;
                      puVar7[1] = '\0';
                      pvVar27 = (vocoldef *)(puVar7 + 1);
                      cmd = local_1258;
                    }
                    sVar8 = strlen((char *)pvVar27);
                    pvVar27 = (vocoldef *)((long)&pvVar27->vocolobj + sVar8);
                    uVar10 = local_1210;
                    uVar17 = local_1220;
                    if (cmd[uVar21 + 1] != (char *)0x0) {
                      *(uchar *)&pvVar27->vocolobj = ' ';
                      pvVar27 = (vocoldef *)((long)&pvVar27->vocolobj + 1);
                    }
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar10 <= uVar18);
                *(uchar *)&pvVar27->vocolobj = '\0';
                iVar13 = 0x2d;
                pvVar28 = local_1218;
              }
            }
            iVar25 = ctx_copy.voccxredo;
            if ((iVar13 == 0x2c) || (uVar15 = 0, iVar13 == 0)) {
              uVar15 = 0xffffffff;
              pvVar27 = pvVar28;
              do {
                uVar15 = uVar15 + 1;
                poVar4 = &pvVar27->vocolobj;
                pvVar27 = pvVar27 + 1;
              } while (*poVar4 != 0xffff);
            }
            local_1274 = uVar15 * 3 + 5;
            if (iVar13 == 0x2d || ctx_copy.voccxredo != 0) {
              sVar8 = strlen((char *)local_1240);
              local_1274 = (int)sVar8 + uVar15 * 3 + 8;
              pvVar28 = local_1218;
              if (iVar25 != 0) {
                iVar13 = 0x2b;
              }
            }
            pvVar5 = local_1238;
            puVar7 = voc_push_list_siz(local_1238,local_1274);
            pvVar27 = local_1240;
            *puVar7 = '\x01';
            *(int *)(puVar7 + 1) = iVar13;
            local_1270 = (ushort *)(puVar7 + 5);
            if ((iVar13 == 0x2c) || (iVar13 == 0)) {
              if (uVar15 != 0) {
                lVar16 = 0;
                do {
                  *(uchar *)local_1270 = '\x02';
                  *(undefined2 *)((long)local_1270 + 1) =
                       *(undefined2 *)((long)&pvVar28->vocolobj + lVar16);
                  local_1270 = (ushort *)((long)local_1270 + 3);
                  lVar16 = lVar16 + 0x28;
                } while ((ulong)uVar15 * 0x28 != lVar16);
              }
            }
            else if ((iVar13 == 0x2d) || (ctx_copy.voccxredo != 0)) {
              local_1270 = (ushort *)(puVar7 + 6);
              puVar7[5] = '\x03';
              sVar8 = strlen((char *)local_1240);
              *local_1270 = (short)sVar8 + 2;
              local_1270 = local_1270 + 1;
              memcpy(local_1270,pvVar27,sVar8 & 0xffffffff);
            }
            pvVar5->voc_stk_cur = (uchar *)pvVar28;
            return;
          }
        }
        ctx_01 = local_1238->voccxerr;
        goto LAB_001f9136;
      }
    }
  }
  ctx_01 = ctx->voccxerr;
LAB_001f9136:
  errsigf(ctx_01,"TADS",0x417);
}

Assistant:

void voc_parse_disambig(voccxdef *ctx)
{
    voccxdef ctx_copy;
    uchar *save_sp;
    runcxdef *rcx = ctx->voccxrun;
    vocoldef *inlist;
    vocoldef *outlist;
    int objcnt;
    char **cmd;
    char *cmdbuf;
    char *oopsbuf;
    objnum actor;
    objnum verb;
    objnum prep;
    objnum otherobj;
    prpnum defprop;
    prpnum accprop;
    prpnum verprop;
    uchar *tokp;
    uint toksiz;
    uchar *objp;
    uint objsiz;
    uchar *lstp;
    uint lstsiz;
    int tokcnt;
    char *p;
    int i;
    int silent;
    int err;
    int unknown_count;

    /* allocate our stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, outlist);
    VOC_STK_ARRAY(ctx, char,     cmdbuf, VOCBUFSIZ);
    VOC_STK_ARRAY(ctx, char,     oopsbuf, VOCBUFSIZ);

    /* get the actor, verb, prep, and otherobj arguments */
    actor = runpopobj(rcx);
    verb = runpopobj(rcx);
    prep = runpopobjnil(rcx);
    otherobj = runpopobjnil(rcx);

    /* 
     *   get the usage parameter, and use it to select the appropriate
     *   defprop and accprop 
     */
    switch(runpopnum(rcx))
    {
    case VOC_PRO_RESOLVE_DOBJ:
    default:
        defprop = PRP_DODEFAULT;
        accprop = PRP_VALIDDO;
        break;

    case VOC_PRO_RESOLVE_IOBJ:
        defprop = PRP_IODEFAULT;
        accprop = PRP_VALIDIO;
        break;

    case VOC_PRO_RESOLVE_ACTOR:
        defprop = PRP_DODEFAULT;
        accprop = PRP_VALIDACTOR;
        break;
    }
    
    /* get the verprop argument */
    verprop = runpopprp(rcx);

    /* pop the token list, and read and skip the length prefix */
    tokp = runpoplst(rcx);
    toksiz = osrp2(tokp) - 2;
    tokp += 2;

    /* pop the object list, and read and skip the length prefix */
    objp = runpoplst(rcx);
    objsiz = osrp2(objp) - 2;
    objp += 2;

    /* pop the "silent" flag */
    silent = runpoplog(rcx);

    /* count the tokens */
    for (lstp = tokp, lstsiz = toksiz, tokcnt = 0 ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* if this is a string, count it */
        if (*lstp == DAT_SSTRING)
            ++tokcnt;
    }

    /* allocate stack space for the command pointers and buffer */
    VOC_STK_ARRAY(ctx, char *, cmd, tokcnt + 1);

    /* extract the tokens into our pointer buffer */
    for (lstp = tokp, lstsiz = toksiz, i = 0, p = cmdbuf ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* if this is a string, count and size it */
        if (*lstp == DAT_SSTRING)
        {
            uint len;
            
            /* store a pointer to the word in the command buffer */
            cmd[i++] = p;

            /* copy the token into the command buffer and null-terminate it */
            len = osrp2(lstp + 1) - 2;
            memcpy(p, lstp + 3, len);
            p[len] = '\0';

            /* move the buffer pointer past this word */
            p += len + 1;
        }
    }

    /* store a null at the end of the command pointer list */
    cmd[i] = 0;

    /*
     *   The object list is provided in the same format as the list
     *   returned by voc_parse_np(), but the leading index number is
     *   optional.  We don't need the leading index for anything, so if
     *   it's there, simply skip it so that we can start with the first
     *   sublist.  
     */
    if (objsiz > 0 && *objp == DAT_NUMBER)
        lstadv(&objp, &objsiz);

    /*
     *   Count the objects in the object list, so that we can figure out
     *   how much we need to allocate for the input object list.  
     */
    for (lstp = objp, lstsiz = objsiz, objcnt = 0 ; lstsiz != 0 ;
         lstadv(&lstp, &lstsiz))
    {
        /* if this is a sublist, parse it */
        if (*lstp == DAT_LIST)
        {
            uchar *subp;
            uint subsiz;

            /* get the sublist pointer, and read and skip the size prefix */
            subp = lstp + 1;
            subsiz = osrp2(subp) - 2;
            subp += 2;

            /* scan the sublist */
            while (subsiz > 0)
            {
                /* if this is an object, count it */
                if (*subp == DAT_OBJECT || *subp == DAT_NIL)
                    ++objcnt;

                /* skip this element */
                lstadv(&subp, &subsiz);
            }
        }
    }

    /* allocate space for the input list */
    VOC_STK_ARRAY(ctx, vocoldef, inlist, objcnt + 1);

    /* we don't have any unknown words yet */
    unknown_count = 0;

    /* parse the list, filling in the input array */
    for (lstp = objp, lstsiz = objsiz, i = 0 ; lstsiz != 0 ;
         lstadv(&lstp, &lstsiz))
    {
        /* if this is a sublist, parse it */
        if (*lstp == DAT_LIST)
        {
            uchar *subp;
            uint subsiz;
            int firstwrd, lastwrd;

            /* get the sublist pointer, and read and skip the size prefix */
            subp = lstp + 1;
            subsiz = osrp2(subp) - 2;
            subp += 2;

            /* in case we don't find token indices, clear them */
            firstwrd = 0;
            lastwrd = 0;

            /* 
             *   the first two elements of the list are the token indices
             *   of the first and last words of this object's noun phrase 
             */
            if (subsiz > 0 && *subp == DAT_NUMBER)
            {
                /* read the first index, adjusting to zero-based indexing */
                firstwrd = (int)osrp4(subp+1) - 1;

                /* make sure it's in range */
                if (firstwrd < 0)
                    firstwrd = 0;
                else if (firstwrd > tokcnt)
                    firstwrd = tokcnt;

                /* skip it */
                lstadv(&subp, &subsiz);
            }
            if (subsiz > 0 && *subp == DAT_NUMBER)
            {
                /* read the last index, adjusting to zero-based indexing */
                lastwrd = (int)osrp4(subp+1) - 1;

                /* make sure it's in range */
                if (lastwrd < firstwrd)
                    lastwrd = firstwrd;
                else if (lastwrd > tokcnt)
                    lastwrd = tokcnt;

                /* skip it */
                lstadv(&subp, &subsiz);
            }

            /* scan the sublist */
            while (subsiz > 0)
            {
                /* if this is an object, store it */
                if (*subp == DAT_OBJECT || *subp == DAT_NIL)
                {
                    /* store the object */
                    if (*subp == DAT_OBJECT)
                        inlist[i].vocolobj = osrp2(subp+1);
                    else
                        inlist[i].vocolobj = MCMONINV;

                    /* set the first and last word pointers */
                    inlist[i].vocolfst = cmd[firstwrd];
                    inlist[i].vocollst = cmd[lastwrd];

                    /* skip the object */
                    lstadv(&subp, &subsiz);

                    /* check for flags */
                    if (subsiz > 0 && *subp == DAT_NUMBER)
                    {
                        /* get the flags value */
                        inlist[i].vocolflg = (int)osrp4(subp+1);

                        /* skip the number in the list */
                        lstadv(&subp, &subsiz);
                    }
                    else
                    {
                        /* clear the flags */
                        inlist[i].vocolflg = 0;
                    }

                    /* if an unknown word was involved, note it */
                    if ((inlist[i].vocolflg & VOCS_UNKNOWN) != 0)
                        ++unknown_count;

                    /* consume the element */
                    ++i;
                }
                else
                {
                    /* skip this element */
                    lstadv(&subp, &subsiz);
                }
            }
        }
    }

    /* terminate the list */
    inlist[i].vocolobj = MCMONINV;
    inlist[i].vocolflg = 0;

    /* 
     *   make a copy of our context, so the disambiguation can't make any
     *   global changes 
     */
    memcpy(&ctx_copy, ctx, sizeof(ctx_copy));

    /*
     *   Count the unknown words and set the count in the context.  This
     *   will allow us to determine after we call the resolver whether the
     *   resolution process cleared up the unknown words (via
     *   parseUnknownDobj/Iobj). 
     */
    ctx_copy.voccxunknown = ctx_copy.voccxlastunk = unknown_count;

    /* disambiguate the noun list */
    err = vocdisambig(&ctx_copy, outlist, inlist,
                      defprop, accprop, verprop, cmd,
                      otherobj, actor, verb, prep, cmdbuf, silent);

    /*
     *   If the error was VOCERR(2) - unknown word - check the input list
     *   to see if it contained any unknown words.  If it does, and we're
     *   not in "silent" mode, flag the error and then give the user a
     *   chance to use "oops" to correct the problem.  If we're in silent
     *   mode, don't display an error and don't allow interactive
     *   correction via "oops."
     *   
     *   It is possible that the unknown word is not in the input list,
     *   but in the user's response to an interactive disambiguation
     *   query.  This is why we must check to see if the unknown word is
     *   in the original input list or not.
     */
    if (err == VOCERR(2) && ctx_copy.voccxunknown != 0 && !silent)
    {
        char *unk;
        int unk_idx;
        char *rpl_text;

        /* 
         *   forget we have unknown words, since we're going to handle
         *   them now
         */
        ctx_copy.voccxunknown = 0;

        /* 
         *   find the unknown word - look up each word until we find one
         *   that's not in the dictionary 
         */
        for (i = 0, unk = 0 ; cmd[i] != 0 ; ++i)
        {
            int t;
            
            /* 
             *   get this word's type - if the word has no type, it's an
             *   unknown word 
             */
            t = voc_lookup_type(ctx, cmd[i], strlen(cmd[i]), TRUE);
            if (t == 0)
            {
                /* this is it - note it and stop searching */
                unk_idx = i;
                unk = cmd[i];
                break;
            }
        }

        /* 
         *   if we didn't find any unknown words, assume the first word
         *   was unknown 
         */
        if (unk == 0)
        {
            unk_idx = 0;
            unk = cmd[0];
        }

        /* display an error, and read a new command */
        rpl_text = voc_read_oops(&ctx_copy, oopsbuf, VOCBUFSIZ, unk);

        /* 
         *   if they didn't respond with "oops," treat the response as a
         *   brand new command to replace the current command 
         */
        if (rpl_text == 0)
        {
            /* 
             *   it's a replacement command - set the redo flag to
             *   indicate that we should process the replacement command 
             */
            ctx_copy.voccxredo = TRUE;

            /* copy the response into the command buffer */
            strcpy(cmdbuf, oopsbuf);
        }
        else
        {
            /* indicate the correction via the result code */
            err = VOCERR(45);

            /* 
             *   Build the new command string.  The new command string
             *   consists of all of the tokens up to the unknown token,
             *   then the replacement text, then all of the remaining
             *   tokens. 
             */
            for (p = cmdbuf, i = 0 ; cmd[i] != 0 ; ++i)
            {
                size_t needed;
                
                /* figure the size needs for this token */
                if (i == unk_idx)
                {
                    /* we need to insert the replacement text */
                    needed = strlen(rpl_text);
                }
                else
                {
                    /* we need to insert this token string */
                    needed = strlen(cmd[i]);
                }
                
                /* 
                 *   if more tokens follow, we need a space after the
                 *   replacement text to separate it from what follows 
                 */
                if (cmd[i+1] != 0 && needed != 0)
                    needed += 1;

                /* leave room for null termination */
                needed += 1;

                /* if we don't have room for this token, stop now */
                if (needed > (size_t)(VOCBUFSIZ - (p - cmdbuf)))
                    break;

                /* 
                 *   if we've reached the unknown token, insert the
                 *   replacement text; otherwise, insert this token
                 */
                if (i == unk_idx)
                {
                    /* insert the replacement text */
                    strcpy(p, rpl_text);
                }
                else if (*cmd[i] == '"')
                {
                    char *p1;
                    char qu;
                    
                    /* 
                     *   Scan the quoted string for embedded double quotes
                     *   - if it has any, use single quotes as the
                     *   delimiter; otherwise, use double quotes as the
                     *   delimiter.  Note that we ignore the first and
                     *   last characters in the string, since these are
                     *   always the delimiting double quotes in the
                     *   original token text.  
                     */
                    for (qu = '"', p1 = cmd[i] + 1 ;
                         *p1 != '\0' && *(p1 + 1) != '\0' ; ++p1)
                    {
                        /* check for an embedded double quote */
                        if (*p1 == '"')
                        {
                            /* switch to single quotes as delimiters */
                            qu = '\'';

                            /* no need to look any further */
                            break;
                        }
                    }

                    /* add the open quote */
                    *p++ = qu;

                    /* 
                     *   add the text, leaving out the first and last
                     *   characters (which are the original quotes) 
                     */
                    if (strlen(cmd[i]) > 2)
                    {
                        memcpy(p, cmd[i] + 1, strlen(cmd[i]) - 2);
                        p += strlen(cmd[i]) - 2;
                    }

                    /* add the closing quote */
                    *p++ = qu;

                    /* null-terminate here so we don't skip any further */
                    *p = '\0';
                }
                else
                {
                    /* copy this word */
                    strcpy(p, cmd[i]);
                }

                /* move past this token */
                p += strlen(p);

                /* add a space if another token follows */
                if (cmd[i+1] != 0)
                    *p++ = ' ';
            }

            /* null-terminate the replacement text */
            *p = '\0';
        }
    }

    /* 
     *   Count the objects.  An object list is returned only on success or
     *   VOCERR(44), which indicates that the list is still ambiguous. 
     */
    if (err == 0 || err == VOCERR(44))
    {
        /* count the objects in the list */
        for (i = 0 ; outlist[i].vocolobj != MCMONINV ; ++i) ;
        objcnt = i;
    }
    else
    {
        /* there's nothing in the list */
        objcnt = 0;
    }

    /* figure out how much space we need for the objects */
    lstsiz = (1+2) * objcnt;
        
    /* add space for the first element, which contains the status code */
    lstsiz += (1 + 4);

    /* if there's a new command string, we'll store it, so make room */
    if (ctx_copy.voccxredo || err == VOCERR(45))
    {
        /* 
         *   add space for the type prefix (1), length prefix (2), and the
         *   string bytes (with no null terminator, of course) 
         */
        lstsiz += (1 + 2 + strlen(cmdbuf));

        /* 
         *   if we're retrying due to the redo flag, always return the
         *   RETRY error code, regardless of what caused us to retry the
         *   command 
         */
        if (ctx_copy.voccxredo)
            err = VOCERR(43);
    }

    /* push a list with space for the objects */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* store the status code in the first element */
    *lstp++ = DAT_NUMBER;
    oswp4s(lstp, err);
    lstp += 4;

    /* store the remainder of the list */
    if (err == 0 || err == VOCERR(44))
    {
        /* fill in the list with the objects */
        for (i = 0 ; i < objcnt ; ++i)
        {
            /* set this element */
            *lstp++ = DAT_OBJECT;
            oswp2(lstp, outlist[i].vocolobj);
            lstp += 2;
        }
    }
    else if (ctx_copy.voccxredo || err == VOCERR(45))
    {
        uint len;
        
        /* there's a new command - return it as the second element */
        *lstp++ = DAT_SSTRING;

        /* store the length */
        len = strlen(cmdbuf);
        oswp2(lstp, len + 2);
        lstp += 2;

        /* store the string */
        memcpy(lstp, cmdbuf, len);
    }

    /* leave the stack frame */
    voc_leave(ctx, save_sp);
}